

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
type_safe::direct_optional_storage<debugger_type>::swap_value
          (direct_optional_storage<debugger_type> *this,
          direct_optional_storage<debugger_type> *other)

{
  bool bVar1;
  lvalue_reference b;
  lvalue_reference pdVar2;
  rvalue_reference args;
  direct_optional_storage<debugger_type> *other_local;
  direct_optional_storage<debugger_type> *this_local;
  
  bVar1 = has_value(this);
  if ((bVar1) && (bVar1 = has_value(other), bVar1)) {
    pdVar2 = get_value(this);
    b = get_value(other);
    ::swap(pdVar2,b);
  }
  else {
    bVar1 = has_value(this);
    if (bVar1) {
      pdVar2 = get_value(this);
      create_value<debugger_type>(other,pdVar2);
      destroy_value(this);
    }
    else {
      bVar1 = has_value(other);
      if (bVar1) {
        args = get_value(other);
        create_value<debugger_type>(this,args);
        destroy_value(other);
      }
    }
  }
  return;
}

Assistant:

void swap_value(direct_optional_storage& other)
    {
        if (has_value() && other.has_value())
        {
            using std::swap;
            swap(get_value(), other.get_value());
        }
        else if (has_value())
        {
            other.create_value(std::move(get_value()));
            destroy_value();
        }
        else if (other.has_value())
        {
            create_value(std::move(other).get_value());
            other.destroy_value();
        }
    }